

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha1_hw.c
# Opt level: O0

int aesni_cbc_hmac_sha1_set_tls1_aad(void *vctx,uchar *aad_rec,int aad_len)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int in_EDX;
  void *in_RSI;
  SHA_CTX *in_RDI;
  uint len;
  uchar *p;
  PROV_AES_HMAC_SHA1_CTX *sctx;
  PROV_AES_HMAC_SHA_CTX *ctx;
  undefined4 in_stack_ffffffffffffffc0;
  SHA_CTX *c;
  int local_4;
  
  if (in_EDX == 0xd) {
    uVar1 = (uint)CONCAT11(*(undefined1 *)((long)in_RSI + 0xb),*(undefined1 *)((long)in_RSI + 0xc));
    if (((byte)in_RDI->data[8] >> 1 & 1) == 0) {
      memcpy(in_RDI[4].data + 9,in_RSI,0xd);
      in_RDI[4].data[7] = 0xd;
      in_RDI[4].data[8] = 0;
      in_RDI[5].h4 = 0x14;
      in_RDI[5].Nl = 0;
      local_4 = 1;
    }
    else {
      *(ulong *)(in_RDI[4].data + 7) = (ulong)uVar1;
      uVar2 = (uint)CONCAT11(*(undefined1 *)((long)in_RSI + 9),*(undefined1 *)((long)in_RSI + 10));
      in_RDI[4].data[9] = uVar2;
      if (0x301 < uVar2) {
        if (uVar1 < 0x10) {
          return 0;
        }
        uVar1 = uVar1 - 0x10;
        *(char *)((long)in_RSI + 0xb) = (char)(uVar1 >> 8);
        *(char *)((long)in_RSI + 0xc) = (char)uVar1;
      }
      c = in_RDI;
      memcpy(&in_RDI[7].Nh,&in_RDI[5].Nh,0x60);
      sha1_update(c,in_RSI,CONCAT44(uVar1,in_stack_ffffffffffffffc0));
      lVar3 = (long)(int)((uVar1 + 0x24 & 0xfffffff0) - uVar1);
      in_RDI[5].h4 = (int)lVar3;
      in_RDI[5].Nl = (int)((ulong)lVar3 >> 0x20);
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int aesni_cbc_hmac_sha1_set_tls1_aad(void *vctx,
                                            unsigned char *aad_rec, int aad_len)
{
    PROV_AES_HMAC_SHA_CTX *ctx = (PROV_AES_HMAC_SHA_CTX *)vctx;
    PROV_AES_HMAC_SHA1_CTX *sctx = (PROV_AES_HMAC_SHA1_CTX *)vctx;
    unsigned char *p = aad_rec;
    unsigned int len;

    if (aad_len != EVP_AEAD_TLS1_AAD_LEN)
        return -1;

    len = p[aad_len - 2] << 8 | p[aad_len - 1];

    if (ctx->base.enc) {
        ctx->payload_length = len;
        if ((ctx->aux.tls_ver =
             p[aad_len - 4] << 8 | p[aad_len - 3]) >= TLS1_1_VERSION) {
            if (len < AES_BLOCK_SIZE)
                return 0;
            len -= AES_BLOCK_SIZE;
            p[aad_len - 2] = len >> 8;
            p[aad_len - 1] = len;
        }
        sctx->md = sctx->head;
        sha1_update(&sctx->md, p, aad_len);
        ctx->tls_aad_pad = (int)(((len + SHA_DIGEST_LENGTH +
                       AES_BLOCK_SIZE) & -AES_BLOCK_SIZE)
                     - len);
        return 1;
    } else {
        memcpy(ctx->aux.tls_aad, aad_rec, aad_len);
        ctx->payload_length = aad_len;
        ctx->tls_aad_pad = SHA_DIGEST_LENGTH;
        return 1;
    }
}